

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::exclusive_maximum_validator
          (exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *schema,
          uri *schema_location,string *custom_message,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  *(undefined ***)&this->field_0x110 = &PTR__validator_base_009a9c58;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_68,"exclusiveMaximum",(allocator<char> *)&local_48);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  keyword_validator(&this->
                     super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ,&PTR_construction_vtable_24__009ab338,&sStack_68,schema,schema_location,
                    custom_message);
  std::__cxx11::string::~string((string *)&sStack_68);
  (this->
  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ).super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>.
  super_validation_message_factory._vptr_validation_message_factory = (_func_int **)0x9ab270;
  *(undefined8 *)&this->field_0x110 = 0x9ab2f8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             &(this->
              super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ).field_0xe0,value);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
            (&local_48,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value);
  std::operator+(&sStack_68,"Exclusive maximum value is ",&local_48);
  std::operator+(&this->message_,&sStack_68," but found ");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

exclusive_maximum_validator(const Json& schema, const uri& schema_location, const std::string& custom_message, const Json& value)
            : keyword_validator<Json>("exclusiveMaximum", schema, schema_location, custom_message), value_(value),
              message_{"Exclusive maximum value is " + value.template as<std::string>() + " but found "}
        {
        }